

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_extract_aux(REF_NODE ref_node,REF_INT *ldim,REF_DBL **aux)

{
  int iVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  long lVar6;
  REF_STATUS RVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  
  iVar1 = ref_node->naux;
  *ldim = iVar1;
  uVar2 = ref_node->max;
  if ((int)(uVar2 * iVar1) < 0) {
    RVar7 = 1;
    pcVar10 = "malloc *aux of REF_DBL negative";
  }
  else {
    pRVar5 = (REF_DBL *)malloc((ulong)(uVar2 * iVar1) << 3);
    *aux = pRVar5;
    if (pRVar5 != (REF_DBL *)0x0) {
      if (0 < (int)uVar2) {
        pRVar3 = ref_node->global;
        lVar6 = 0;
        uVar8 = 0;
        do {
          if ((-1 < pRVar3[uVar8]) && (lVar9 = (long)ref_node->naux, 0 < lVar9)) {
            pRVar4 = ref_node->aux;
            lVar11 = 0;
            do {
              pRVar5[lVar11] = *(REF_DBL *)((long)pRVar4 + lVar11 * 8 + lVar6 * lVar9);
              lVar11 = lVar11 + 1;
            } while (lVar9 != lVar11);
          }
          uVar8 = uVar8 + 1;
          pRVar5 = pRVar5 + iVar1;
          lVar6 = lVar6 + 8;
        } while (uVar8 != uVar2);
      }
      return 0;
    }
    RVar7 = 2;
    pcVar10 = "malloc *aux of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa97,
         "ref_node_extract_aux",pcVar10);
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_node_extract_aux(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **aux) {
  REF_INT iaux, node;
  (*ldim) = ref_node_naux(ref_node);
  ref_malloc(*aux, (*ldim) * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      (*aux)[iaux + (*ldim) * node] = ref_node_aux(ref_node, iaux, node);
    }
  }
  return REF_SUCCESS;
}